

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
          (WindowedPiecewiseConstant2D *this,Allocator alloc)

{
  Array2D<double>::Array2D((Array2D<double> *)this,(allocator_type)alloc.memoryResource);
  Array2D<float>::Array2D(&this->func,(allocator_type)alloc.memoryResource);
  return;
}

Assistant:

WindowedPiecewiseConstant2D(Allocator alloc) : sat(alloc), func(alloc) {}